

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  IVar6 = window->Scroll;
  fVar8 = (window->ScrollTarget).x;
  if (fVar8 < 3.4028235e+38) {
    fVar1 = (window->ScrollTargetCenterRatio).x;
    fVar2 = (window->ScrollTargetEdgeSnapDist).x;
    if (0.0 < fVar2) {
      if (fVar8 <= fVar2) {
        fVar8 = fVar8 * fVar1 + 0.0;
      }
      else {
        fVar4 = (window->ScrollMax).x + (window->Size).x;
        if (fVar4 - fVar2 <= fVar8) {
          fVar8 = (fVar4 - fVar8) * fVar1 + fVar8;
        }
      }
    }
    IVar6.y = IVar6.y;
    IVar6.x = fVar8 - fVar1 * ((window->SizeFull).x - (window->ScrollbarSizes).x);
  }
  auVar10._8_8_ = 0;
  auVar10._0_4_ = IVar6.x;
  auVar10._4_4_ = IVar6.y;
  if ((window->ScrollTarget).y < 3.4028235e+38) {
    fVar4 = ImGuiWindow::TitleBarHeight(window);
    fVar5 = ImGuiWindow::MenuBarHeight(window);
    fVar8 = (window->ScrollTarget).y;
    fVar1 = (window->ScrollTargetCenterRatio).y;
    fVar2 = (window->ScrollTargetEdgeSnapDist).y;
    if (0.0 < fVar2) {
      if (fVar8 <= fVar2) {
        fVar8 = fVar8 * fVar1 + 0.0;
      }
      else {
        fVar3 = ((window->ScrollMax).y + (window->Size).y) - (fVar5 + fVar4);
        if (fVar3 - fVar2 <= fVar8) {
          fVar8 = (fVar3 - fVar8) * fVar1 + fVar8;
        }
      }
    }
    auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar8 - fVar1 * (((window->SizeFull).y -
                                                                    (window->ScrollbarSizes).y) -
                                                                   (fVar5 + fVar4)))),0x10);
  }
  auVar7 = vcmpps_avx(ZEXT416(0) << 0x20,auVar10,2);
  auVar10 = vandps_avx(auVar7,auVar10);
  auVar7._0_4_ = (int)auVar10._0_4_;
  auVar7._4_4_ = (int)auVar10._4_4_;
  auVar7._8_4_ = (int)auVar10._8_4_;
  auVar7._12_4_ = (int)auVar10._12_4_;
  auVar10 = vcvtdq2ps_avx(auVar7);
  IVar6 = auVar10._0_8_;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    auVar9._8_8_ = 0;
    auVar9._0_4_ = (window->ScrollMax).x;
    auVar9._4_4_ = (window->ScrollMax).y;
    auVar10 = vminps_avx(auVar10,auVar9);
    IVar6 = auVar10._0_8_;
  }
  return IVar6;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window)
{
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float center_x_ratio = window->ScrollTargetCenterRatio.x;
        float scroll_target_x = window->ScrollTarget.x;
        float snap_x_min = 0.0f;
        float snap_x_max = window->ScrollMax.x + window->Size.x;
        if (window->ScrollTargetEdgeSnapDist.x > 0.0f)
            scroll_target_x = CalcScrollEdgeSnap(scroll_target_x, snap_x_min, snap_x_max, window->ScrollTargetEdgeSnapDist.x, center_x_ratio);
        scroll.x = scroll_target_x - center_x_ratio * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float center_y_ratio = window->ScrollTargetCenterRatio.y;
        float scroll_target_y = window->ScrollTarget.y;
        float snap_y_min = 0.0f;
        float snap_y_max = window->ScrollMax.y + window->Size.y - decoration_up_height;
        if (window->ScrollTargetEdgeSnapDist.y > 0.0f)
            scroll_target_y = CalcScrollEdgeSnap(scroll_target_y, snap_y_min, snap_y_max, window->ScrollTargetEdgeSnapDist.y, center_y_ratio);
        scroll.y = scroll_target_y - center_y_ratio * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}